

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

void __thiscall
zmq::socket_base_t::monitor_event
          (socket_base_t *this,uint64_t event_,uint64_t *values_,uint64_t values_count_,
          endpoint_uri_pair_t *endpoint_uri_pair_)

{
  int iVar1;
  string *psVar2;
  undefined2 *puVar3;
  uint64_t *puVar4;
  void *pvVar5;
  uint64_t i;
  ulong uVar6;
  uint64_t uVar7;
  string *psVar8;
  bool bVar9;
  zmq_msg_t msg;
  
  if (this->_monitor_socket != (void *)0x0) {
    iVar1 = (this->super_own_t).options.monitor_event_version;
    if (iVar1 == 2) {
      zmq_msg_init_size(&msg,8);
      puVar4 = (uint64_t *)zmq_msg_data(&msg);
      *puVar4 = event_;
      zmq_msg_send(&msg,this->_monitor_socket,2);
      zmq_msg_init_size(&msg,8);
      puVar4 = (uint64_t *)zmq_msg_data(&msg);
      *puVar4 = values_count_;
      zmq_msg_send(&msg,this->_monitor_socket,2);
      for (uVar7 = 0; values_count_ != uVar7; uVar7 = uVar7 + 1) {
        zmq_msg_init_size(&msg,8);
        puVar4 = (uint64_t *)zmq_msg_data(&msg);
        *puVar4 = values_[uVar7];
        zmq_msg_send(&msg,this->_monitor_socket,2);
      }
      zmq_msg_init_size(&msg,(endpoint_uri_pair_->local)._M_string_length);
      pvVar5 = zmq_msg_data(&msg);
      memcpy(pvVar5,(endpoint_uri_pair_->local)._M_dataplus._M_p,
             (endpoint_uri_pair_->local)._M_string_length);
      zmq_msg_send(&msg,this->_monitor_socket,2);
      psVar8 = &endpoint_uri_pair_->remote;
      psVar2 = &endpoint_uri_pair_->remote;
    }
    else {
      if (iVar1 != 1) {
        return;
      }
      if (0xffff < event_) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "event_ <= std::numeric_limits<uint16_t>::max ()",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                ,0x7bc);
        fflush(_stderr);
        zmq_abort("event_ <= std::numeric_limits<uint16_t>::max ()");
      }
      if (values_count_ != 1) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","values_count_ == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                ,0x7be);
        fflush(_stderr);
        zmq_abort("values_count_ == 1");
      }
      uVar6 = *values_;
      if (uVar6 >> 0x20 != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "values_[0] <= std::numeric_limits<uint32_t>::max ()",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                ,0x7c0);
        fflush(_stderr);
        zmq_abort("values_[0] <= std::numeric_limits<uint32_t>::max ()");
        uVar6 = *values_;
      }
      zmq_msg_init_size(&msg,6);
      puVar3 = (undefined2 *)zmq_msg_data(&msg);
      *puVar3 = (short)event_;
      *(int *)(puVar3 + 1) = (int)uVar6;
      zmq_msg_send(&msg,this->_monitor_socket,2);
      bVar9 = endpoint_uri_pair_->local_type != endpoint_type_bind;
      psVar8 = &endpoint_uri_pair_->local + bVar9;
      psVar2 = &endpoint_uri_pair_->local + bVar9;
    }
    zmq_msg_init_size(&msg,psVar2->_M_string_length);
    pvVar5 = zmq_msg_data(&msg);
    memcpy(pvVar5,(psVar8->_M_dataplus)._M_p,psVar2->_M_string_length);
    zmq_msg_send(&msg,this->_monitor_socket,0);
  }
  return;
}

Assistant:

void zmq::socket_base_t::monitor_event (
  uint64_t event_,
  const uint64_t values_[],
  uint64_t values_count_,
  const endpoint_uri_pair_t &endpoint_uri_pair_) const
{
    // this is a private method which is only called from
    // contexts where the _monitor_sync mutex has been locked before

    if (_monitor_socket) {
        zmq_msg_t msg;

        switch (options.monitor_event_version) {
            case 1: {
                //  The API should not allow to activate unsupported events
                zmq_assert (event_ <= std::numeric_limits<uint16_t>::max ());
                //  v1 only allows one value
                zmq_assert (values_count_ == 1);
                zmq_assert (values_[0]
                            <= std::numeric_limits<uint32_t>::max ());

                //  Send event and value in first frame
                const uint16_t event = static_cast<uint16_t> (event_);
                const uint32_t value = static_cast<uint32_t> (values_[0]);
                zmq_msg_init_size (&msg, sizeof (event) + sizeof (value));
                uint8_t *data = static_cast<uint8_t *> (zmq_msg_data (&msg));
                //  Avoid dereferencing uint32_t on unaligned address
                memcpy (data + 0, &event, sizeof (event));
                memcpy (data + sizeof (event), &value, sizeof (value));
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                const std::string &endpoint_uri =
                  endpoint_uri_pair_.identifier ();

                //  Send address in second frame
                zmq_msg_init_size (&msg, endpoint_uri.size ());
                memcpy (zmq_msg_data (&msg), endpoint_uri.c_str (),
                        endpoint_uri.size ());
                zmq_msg_send (&msg, _monitor_socket, 0);
            } break;
            case 2: {
                //  Send event in first frame (64bit unsigned)
                zmq_msg_init_size (&msg, sizeof (event_));
                memcpy (zmq_msg_data (&msg), &event_, sizeof (event_));
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                //  Send number of values that will follow in second frame
                zmq_msg_init_size (&msg, sizeof (values_count_));
                memcpy (zmq_msg_data (&msg), &values_count_,
                        sizeof (values_count_));
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                //  Send values in third-Nth frames (64bit unsigned)
                for (uint64_t i = 0; i < values_count_; ++i) {
                    zmq_msg_init_size (&msg, sizeof (values_[i]));
                    memcpy (zmq_msg_data (&msg), &values_[i],
                            sizeof (values_[i]));
                    zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);
                }

                //  Send local endpoint URI in second-to-last frame (string)
                zmq_msg_init_size (&msg, endpoint_uri_pair_.local.size ());
                memcpy (zmq_msg_data (&msg), endpoint_uri_pair_.local.c_str (),
                        endpoint_uri_pair_.local.size ());
                zmq_msg_send (&msg, _monitor_socket, ZMQ_SNDMORE);

                //  Send remote endpoint URI in last frame (string)
                zmq_msg_init_size (&msg, endpoint_uri_pair_.remote.size ());
                memcpy (zmq_msg_data (&msg), endpoint_uri_pair_.remote.c_str (),
                        endpoint_uri_pair_.remote.size ());
                zmq_msg_send (&msg, _monitor_socket, 0);
            } break;
        }
    }
}